

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<int_(int,_int)> * __thiscall
testing::internal::TypedExpectation<int_(int,_int)>::Times
          (TypedExpectation<int_(int,_int)> *this,int n)

{
  TypedExpectation<int_(int,_int)> *pTVar1;
  Cardinality local_28;
  int local_14;
  TypedExpectation<int_(int,_int)> *pTStack_10;
  int n_local;
  TypedExpectation<int_(int,_int)> *this_local;
  
  local_14 = n;
  pTStack_10 = this;
  Exactly((testing *)&local_28,n);
  pTVar1 = Times(this,&local_28);
  Cardinality::~Cardinality(&local_28);
  return pTVar1;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }